

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
* __thiscall
kratos::VarSlice::get_slice_index
          (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           *__return_storage_ptr__,VarSlice *this)

{
  pair<unsigned_int,_unsigned_int> local_24;
  undefined1 local_19;
  VarSlice *local_18;
  VarSlice *this_local;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (VarSlice *)__return_storage_ptr__;
  (*(this->parent_var->super_IRNode)._vptr_IRNode[0x24])();
  local_24 = std::make_pair<unsigned_int_const&,unsigned_int_const&>(&this->high,&this->low);
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)__return_storage_ptr__,&local_24);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<uint32_t, uint32_t>> VarSlice::get_slice_index() const {
    std::vector<std::pair<uint32_t, uint32_t>> result = parent_var->get_slice_index();
    result.emplace_back(std::make_pair(high, low));
    return result;
}